

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ParamAssignmentSyntax * __thiscall slang::parsing::Parser::parseParamValue(Parser *this)

{
  Token name_00;
  Token dot_00;
  Token openParen;
  Token closeParen;
  bool bVar1;
  __tuple_element_t<0UL,_tuple<Token,_Token,_ExpressionSyntax_*>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<Token,_Token,_ExpressionSyntax_*>_> *p_Var3;
  undefined8 in_RDI;
  Token TVar4;
  type *expr;
  type *innerCloseParen;
  type *innerOpenParen;
  Token name;
  Token dot;
  ExpressionSyntax *in_stack_ffffffffffffff08;
  SyntaxFactory *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  ParserBase *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  ParserBase *in_stack_ffffffffffffff30;
  Info *in_stack_ffffffffffffff40;
  Parser *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  bitmask<slang::parsing::detail::ExpressionOptions> options;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff98;
  ParserBase *in_stack_ffffffffffffffa0;
  ParserBase *in_stack_ffffffffffffffa8;
  Info *local_30;
  NamedParamAssignmentSyntax *local_8;
  
  options.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff20,
                           (TokenKind)((ulong)in_stack_ffffffffffffff18 >> 0x30));
  if (bVar1) {
    ParserBase::consume(in_stack_ffffffffffffff30);
    TVar4 = ParserBase::expect(in_stack_ffffffffffffffa0,
                               (TokenKind)((ulong)in_stack_ffffffffffffff98 >> 0x30));
    ParserBase::
    parseGroupOrSkip<slang::parsing::Parser::parseParamValue()::__0,slang::syntax::ExpressionSyntax*>
              (in_stack_ffffffffffffffa8,(TokenKind)((ulong)in_RDI >> 0x30),
               (TokenKind)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff98);
    p_Var2 = std::
             get<0ul,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*>
                       ((tuple<slang::parsing::Token,_slang::parsing::Token,_slang::syntax::ExpressionSyntax_*>
                         *)0x887611);
    p_Var3 = std::
             get<1ul,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*>
                       ((tuple<slang::parsing::Token,_slang::parsing::Token,_slang::syntax::ExpressionSyntax_*>
                         *)0x887626);
    std::get<2ul,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*>
              ((tuple<slang::parsing::Token,_slang::parsing::Token,_slang::syntax::ExpressionSyntax_*>
                *)0x88763b);
    local_30 = TVar4._0_8_;
    dot_00.info = in_stack_ffffffffffffff40;
    dot_00.kind = (short)in_RDI;
    dot_00._2_1_ = (char)((ulong)in_RDI >> 0x10);
    dot_00.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
    dot_00.rawLen = (int)((ulong)in_RDI >> 0x20);
    name_00.info = (Info *)in_stack_ffffffffffffff30;
    name_00.kind = (short)in_stack_ffffffffffffff28;
    name_00._2_1_ = (char)((ulong)in_stack_ffffffffffffff28 >> 0x10);
    name_00.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff28 >> 0x18);
    name_00.rawLen = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    openParen.info = *(Info **)p_Var2;
    openParen._0_8_ = p_Var3->info;
    closeParen.info = local_30;
    closeParen._0_8_ = p_Var2->info;
    local_8 = slang::syntax::SyntaxFactory::namedParamAssignment
                        ((SyntaxFactory *)p_Var3->info,dot_00,name_00,openParen,
                         *(ExpressionSyntax **)p_Var3,closeParen);
  }
  else {
    memset(&stack0xffffffffffffff44,0,4);
    bitmask<slang::parsing::detail::ExpressionOptions>::bitmask
              ((bitmask<slang::parsing::detail::ExpressionOptions> *)&stack0xffffffffffffff44);
    parseMinTypMaxExpression(in_stack_ffffffffffffff80,options);
    local_8 = (NamedParamAssignmentSyntax *)
              slang::syntax::SyntaxFactory::orderedParamAssignment
                        (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  return &local_8->super_ParamAssignmentSyntax;
}

Assistant:

ParamAssignmentSyntax& Parser::parseParamValue() {
    // check for named arguments
    if (peek(TokenKind::Dot)) {
        auto dot = consume();
        auto name = expect(TokenKind::Identifier);

        auto [innerOpenParen, innerCloseParen,
              expr] = parseGroupOrSkip(TokenKind::OpenParenthesis, TokenKind::CloseParenthesis,
                                       [this]() { return &parseMinTypMaxExpression(); });

        return factory.namedParamAssignment(dot, name, innerOpenParen, expr, innerCloseParen);
    }

    return factory.orderedParamAssignment(parseMinTypMaxExpression());
}